

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

void Hop_ManCreateRefs(Hop_Man_t *p)

{
  undefined1 *puVar1;
  uint *puVar2;
  int *piVar3;
  Hop_Obj_t *pHVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  
  if (p->fRefCount == 0) {
    p->fRefCount = 1;
    puVar1 = &p->pConst1->field_0x20;
    *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
    pVVar6 = p->vPis;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        puVar2 = (uint *)((long)pVVar6->pArray[lVar5] + 0x20);
        *puVar2 = *puVar2 & 0x3f;
        lVar5 = lVar5 + 1;
        pVVar6 = p->vPis;
      } while (lVar5 < pVVar6->nSize);
    }
    if (0 < p->nTableSize) {
      lVar5 = 0;
      do {
        if (p->pTable[lVar5] != (Hop_Obj_t *)0x0) {
          puVar1 = &p->pTable[lVar5]->field_0x20;
          *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nTableSize);
    }
    pVVar6 = p->vPos;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        puVar2 = (uint *)((long)pVVar6->pArray[lVar5] + 0x20);
        *puVar2 = *puVar2 & 0x3f;
        lVar5 = lVar5 + 1;
        pVVar6 = p->vPos;
      } while (lVar5 < pVVar6->nSize);
    }
    if (0 < p->nTableSize) {
      lVar5 = 0;
      do {
        pHVar4 = p->pTable[lVar5];
        if (pHVar4 != (Hop_Obj_t *)0x0) {
          piVar3 = (int *)(((ulong)pHVar4->pFanin0 & 0xfffffffffffffffe) + 0x20);
          *piVar3 = *piVar3 + 0x40;
          piVar3 = (int *)(((ulong)pHVar4->pFanin1 & 0xfffffffffffffffe) + 0x20);
          *piVar3 = *piVar3 + 0x40;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nTableSize);
    }
    pVVar6 = p->vPos;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        piVar3 = (int *)((*(ulong *)((long)pVVar6->pArray[lVar5] + 0x10) & 0xfffffffffffffffe) +
                        0x20);
        *piVar3 = *piVar3 + 0x40;
        lVar5 = lVar5 + 1;
        pVVar6 = p->vPos;
      } while (lVar5 < pVVar6->nSize);
    }
  }
  return;
}

Assistant:

void Hop_ManCreateRefs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    if ( p->fRefCount )
        return;
    p->fRefCount = 1;
    // clear refs
    Hop_ObjClearRef( Hop_ManConst1(p) );
    Hop_ManForEachPi( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjClearRef( pObj );
    // set refs
    Hop_ManForEachNode( p, pObj, i )
    {
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
        Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
}